

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O3

void __thiscall IPStats::SubmitCborPacket(IPStats *this,cdns *cdns_ctx,size_t packet_id)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  pointer pcVar4;
  pointer pcVar5;
  pointer pcVar6;
  size_t __n;
  pointer pcVar7;
  bool bVar8;
  long lVar9;
  long lVar10;
  bool stored;
  IPStatsRecord ipsr;
  bool local_399;
  IPStatsRecord local_398;
  
  memset(&local_398,0,0x368);
  pcVar4 = (cdns_ctx->block).queries.super__Vector_base<cdns_query,_std::allocator<cdns_query>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar2 = cdns_ctx->index_offset;
  lVar10 = (long)iVar2;
  if (iVar2 <= pcVar4[packet_id].client_address_index) {
    lVar9 = pcVar4[packet_id].client_address_index - lVar10;
    pcVar6 = (cdns_ctx->block).tables.addresses.
             super__Vector_base<cbor_bytes,_std::allocator<cbor_bytes>_>._M_impl.
             super__Vector_impl_data._M_start;
    __n = pcVar6[lVar9].l;
    if ((__n != 0x10) && (__n != 4)) {
      return;
    }
    local_398.ipaddr_length = __n;
    memcpy(local_398.ip_addr,pcVar6[lVar9].v,__n);
    if ((__n != 0x10) && (__n != 4)) {
      return;
    }
  }
  iVar3 = pcVar4[packet_id].query_signature_index;
  if (iVar2 <= iVar3) {
    pcVar5 = (cdns_ctx->block).tables.q_sigs.
             super__Vector_base<cdns_query_signature,_std::allocator<cdns_query_signature>_>._M_impl
             .super__Vector_impl_data._M_start;
    local_398.query_volume = local_398.query_volume + 1;
    if ((((pcVar5 != (pointer)0x0) && (iVar2 <= pcVar4[packet_id].query_name_index)) &&
        (lVar9 = pcVar4[packet_id].query_name_index - lVar10,
        pcVar6 = (cdns_ctx->block).tables.name_rdata.
                 super__Vector_base<cbor_bytes,_std::allocator<cbor_bytes>_>._M_impl.
                 super__Vector_impl_data._M_start,
        bVar8 = IPStatsRecord::SetQName(&local_398,pcVar6[lVar9].v,(uint32_t)pcVar6[lVar9].l,this),
        bVar8)) &&
       (bVar8 = IPStatsRecord::SetTime(&local_398,(cdns_ctx->block).preamble.earliest_time_sec),
       bVar8)) {
      if (pcVar4[packet_id].query_name_index < cdns_ctx->index_offset) {
        if (!bVar8) {
          return;
        }
      }
      else {
        lVar10 = (long)pcVar5[iVar3 - lVar10].query_classtype_index - (long)cdns_ctx->index_offset;
        pcVar7 = (cdns_ctx->block).tables.class_ids.
                 super__Vector_base<cdns_class_id,_std::allocator<cdns_class_id>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (pcVar7[lVar10].rr_class == 1) {
          lVar9 = 0;
          do {
            if (*(int *)((long)RR_subset + lVar9) == pcVar7[lVar10].rr_type) {
              plVar1 = (long *)((long)local_398.rr_types + lVar9 * 2);
              *plVar1 = *plVar1 + 1;
              break;
            }
            lVar9 = lVar9 + 4;
          } while (lVar9 != 0x20);
        }
      }
      local_399 = false;
      BinHash<IPStatsRecord>::InsertOrAdd(&this->ip_records,&local_398,true,&local_399);
    }
  }
  return;
}

Assistant:

void IPStats::SubmitCborPacket(cdns* cdns_ctx, size_t packet_id)
{
    /* TODO: add to database. */
    bool is_valid = true;
    IPStatsRecord ipsr;
    cdns_query* query = &cdns_ctx->block.queries[packet_id];
    cdns_query_signature* q_sig = NULL;

    if (query->client_address_index >= cdns_ctx->index_offset){
        size_t addrid = (size_t)query->client_address_index - cdns_ctx->index_offset;
        if (!ipsr.SetIP(cdns_ctx->block.tables.addresses[addrid].l, cdns_ctx->block.tables.addresses[addrid].v)) {
            /* malformed IP address. Cannot do anything with that record. */
            is_valid = false;
        }
    }

    if (is_valid) {
        if (query->query_signature_index >= cdns_ctx->index_offset) {
            q_sig = &cdns_ctx->block.tables.q_sigs[(size_t)query->query_signature_index - cdns_ctx->index_offset];
        }


        ipsr.query_volume += 1;

        /* Queried name and response type */
        if (q_sig != NULL &&
            query->query_name_index >= cdns_ctx->index_offset) {
            size_t nid = (size_t)query->query_name_index - cdns_ctx->index_offset;
            uint8_t* q_name = cdns_ctx->block.tables.name_rdata[nid].v;
            uint32_t q_name_length = (uint32_t)cdns_ctx->block.tables.name_rdata[nid].l;
            is_valid = ipsr.SetQName(q_name, q_name_length, this);
        }
        else {
            is_valid = false;
        }
    }

    /* Set date */
    if (is_valid) {
        /* Find hour and date */
        is_valid = ipsr.SetTime(cdns_ctx->block.preamble.earliest_time_sec);
    }

    /* TODO: Set RR */
    if (is_valid) {
        /* Find qr_class, so leak analysis can distinguish between Internet and Chaos */
        int rr_class = 0;
        int rr_type = 0;
        if (q_sig != NULL &&
            query->query_name_index >= cdns_ctx->index_offset) {
            /* assume just one query per q_sig, but sometimes there is none. */
            size_t cid = (size_t)q_sig->query_classtype_index - cdns_ctx->index_offset;
            rr_class = cdns_ctx->block.tables.class_ids[cid].rr_class;
            rr_type = cdns_ctx->block.tables.class_ids[cid].rr_type;
            is_valid = ipsr.SetRR(rr_type, rr_class);
        }
    }

    /* If the packet is valid, add the record to the table of addresses */
    if (is_valid) {
        bool stored = false;
        this->ip_records.InsertOrAdd(&ipsr, true, &stored);
    }
}